

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O1

int Abc_NtkGetMultiRefNum(Abc_Ntk_t *pNtk)

{
  void *pvVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                  ,0xe4,"int Abc_NtkGetMultiRefNum(Abc_Ntk_t *)");
  }
  lVar3 = (long)pNtk->vObjs->nSize;
  if (lVar3 < 1) {
    iVar2 = 0;
  }
  else {
    lVar4 = 0;
    iVar2 = 0;
    do {
      pvVar1 = pNtk->vObjs->pArray[lVar4];
      if ((pvVar1 != (void *)0x0) && ((*(uint *)((long)pvVar1 + 0x14) & 0xf) == 7)) {
        iVar2 = iVar2 + (uint)(1 < *(int *)((long)pvVar1 + 0x2c));
      }
      lVar4 = lVar4 + 1;
    } while (lVar3 != lVar4);
  }
  return iVar2;
}

Assistant:

int Abc_NtkGetMultiRefNum( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int nNodes, i;
    assert( Abc_NtkIsStrash(pNtk) );
    nNodes = 0;
    Abc_NtkForEachNode( pNtk, pNode, i )
        nNodes += (int)(Abc_ObjFanoutNum(pNode) > 1);
    return nNodes;
}